

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

Delay3Control * __thiscall
slang::BumpAllocator::
emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,Expression **args_1,Expression **args_2,
          SourceRange *args_3)

{
  SourceRange sourceRange;
  Delay3Control *pDVar1;
  Delay3Control *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Expression *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pDVar1 = (Delay3Control *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::Delay3Control::Delay3Control
            (in_RCX,in_R8,(Expression *)(in_R8->type).ptr,*(Expression **)in_R8,sourceRange);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }